

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

parser * init_parse_profile(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_profile_name);
  parser_reg(p,"params int block int rooms int unusual int rarity",parse_profile_params);
  parser_reg(p,"tunnel int rnd int chg int con int pen int jct",parse_profile_tunnel);
  parser_reg(p,"streamer int den int rng int mag int mc int qua int qc",parse_profile_streamer);
  parser_reg(p,
             "room sym name int rating int height int width int level int pit int rarity int cutoff"
             ,parse_profile_room);
  parser_reg(p,"min-level int min",parse_profile_min_level);
  parser_reg(p,"alloc int alloc",parse_profile_alloc);
  return p;
}

Assistant:

static struct parser *init_parse_profile(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_profile_name);
	parser_reg(p, "params int block int rooms int unusual int rarity", parse_profile_params);
	parser_reg(p, "tunnel int rnd int chg int con int pen int jct", parse_profile_tunnel);
	parser_reg(p, "streamer int den int rng int mag int mc int qua int qc", parse_profile_streamer);
	parser_reg(p, "room sym name int rating int height int width int level int pit int rarity int cutoff", parse_profile_room);
	parser_reg(p, "min-level int min", parse_profile_min_level);
	parser_reg(p, "alloc int alloc", parse_profile_alloc);
	return p;
}